

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O0

void __thiscall
CoreTest_FormatForeignStrings_Test::TestBody(CoreTest_FormatForeignStrings_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  wchar_t *in_stack_fffffffffffffd78;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  undefined7 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd97;
  char *in_stack_fffffffffffffd98;
  int line;
  undefined7 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda7;
  wchar_t *in_stack_fffffffffffffda8;
  Type TVar5;
  wchar_t *s;
  my_string<char> *in_stack_fffffffffffffdb0;
  undefined7 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbf;
  Message *in_stack_fffffffffffffdf8;
  AssertHelper *in_stack_fffffffffffffe00;
  wstring local_1e0 [32];
  AssertionResult local_1c0 [5];
  wstring local_170 [32];
  AssertionResult local_150 [2];
  undefined4 local_12c;
  wchar_t local_128 [4];
  wstring local_118 [32];
  AssertionResult local_f8 [2];
  undefined4 local_d4;
  wstring local_b0 [32];
  AssertionResult local_90 [3];
  undefined4 local_5c;
  string local_38 [32];
  AssertionResult local_18;
  
  my_ns::my_string<char>::my_string(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
  local_5c = 0x2a;
  fmt::v5::format<my_ns::my_string<char>,int>
            ((my_string<char> *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
             (int *)in_stack_fffffffffffffdb0);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[3]>
            (in_stack_fffffffffffffd98,
             (char *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
             in_stack_fffffffffffffd88,
             (char (*) [3])CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  std::__cxx11::string::~string(local_38);
  my_ns::my_string<char>::~my_string((my_string<char> *)0x124485);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffdb0);
    testing::AssertionResult::failure_message((AssertionResult *)0x124525);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffdb0,
               (Type)((ulong)in_stack_fffffffffffffda8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
               (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
    testing::Message::~Message((Message *)0x124582);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1245da);
  my_ns::my_string<wchar_t>::my_string
            ((my_string<wchar_t> *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  TVar5 = (Type)((ulong)in_stack_fffffffffffffda8 >> 0x20);
  local_d4 = 0x2a;
  fmt::v5::format<my_ns::my_string<wchar_t>,int>
            ((my_string<wchar_t> *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
             (int *)in_stack_fffffffffffffdb0);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::wstring,wchar_t[3]>
            (in_stack_fffffffffffffd98,
             (char *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffffd88,
             (wchar_t (*) [3])CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  std::__cxx11::wstring::~wstring(local_b0);
  my_ns::my_string<wchar_t>::~my_string((my_string<wchar_t> *)0x124660);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_90);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffdb0);
    in_stack_fffffffffffffdb0 =
         (my_string<char> *)testing::AssertionResult::failure_message((AssertionResult *)0x124712);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffdb0,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
               (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
    testing::Message::~Message((Message *)0x12476f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1247c7);
  s = local_128;
  FakeQt::QString::QString
            ((QString *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
             in_stack_fffffffffffffd78);
  local_12c = 0x2a;
  fmt::v5::format<FakeQt::QString,int>
            ((QString *)CONCAT17(uVar2,in_stack_fffffffffffffdb8),(int *)in_stack_fffffffffffffdb0);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::wstring,wchar_t[3]>
            (in_stack_fffffffffffffd98,
             (char *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffffd88,
             (wchar_t (*) [3])CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  std::__cxx11::wstring::~wstring(local_118);
  FakeQt::QString::~QString((QString *)0x12484d);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(local_f8);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)in_stack_fffffffffffffdb0);
    in_stack_fffffffffffffd98 =
         testing::AssertionResult::failure_message((AssertionResult *)0x1248ff);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffdb0,(Type)((ulong)s >> 0x20),
               (char *)CONCAT17(uVar3,in_stack_fffffffffffffda0),
               (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
    testing::Message::~Message((Message *)0x12495c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1249b4);
  FakeQt::QString::QString
            ((QString *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
             in_stack_fffffffffffffd78);
  my_ns::my_string<wchar_t>::my_string((my_string<wchar_t> *)in_stack_fffffffffffffdb0,s);
  fmt::v5::format<FakeQt::QString,my_ns::my_string<wchar_t>>
            ((QString *)CONCAT17(uVar2,in_stack_fffffffffffffdb8),
             (my_string<wchar_t> *)in_stack_fffffffffffffdb0);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::wstring,wchar_t[3]>
            (in_stack_fffffffffffffd98,
             (char *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffffd88,
             (wchar_t (*) [3])CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  std::__cxx11::wstring::~wstring(local_170);
  my_ns::my_string<wchar_t>::~my_string((my_string<wchar_t> *)0x124a43);
  FakeQt::QString::~QString((QString *)0x124a50);
  uVar4 = testing::AssertionResult::operator_cast_to_bool(local_150);
  if (!(bool)uVar4) {
    testing::Message::Message((Message *)in_stack_fffffffffffffdb0);
    in_stack_fffffffffffffd88 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x124b28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffdb0,(Type)((ulong)s >> 0x20),
               (char *)CONCAT17(uVar3,in_stack_fffffffffffffda0),
               (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
               (char *)CONCAT17(uVar4,in_stack_fffffffffffffd90));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
    testing::Message::~Message((Message *)0x124b85);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x124bdd);
  my_ns::my_string<wchar_t>::my_string((my_string<wchar_t> *)in_stack_fffffffffffffdb0,s);
  TVar5 = (Type)((ulong)s >> 0x20);
  FakeQt::QString::QString
            ((QString *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
             in_stack_fffffffffffffd78);
  fmt::v5::format<my_ns::my_string<wchar_t>,FakeQt::QString>
            ((my_string<wchar_t> *)CONCAT17(uVar2,in_stack_fffffffffffffdb8),
             (QString *)in_stack_fffffffffffffdb0);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::wstring,wchar_t[3]>
            (in_stack_fffffffffffffd98,(char *)CONCAT17(uVar4,in_stack_fffffffffffffd90),
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffffd88,
             (wchar_t (*) [3])CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  line = (int)((ulong)in_stack_fffffffffffffd98 >> 0x20);
  std::__cxx11::wstring::~wstring(local_1e0);
  FakeQt::QString::~QString((QString *)0x124c63);
  my_ns::my_string<wchar_t>::~my_string((my_string<wchar_t> *)0x124c70);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_1c0);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffdb0);
    testing::AssertionResult::failure_message((AssertionResult *)0x124d42);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffdb0,TVar5,
               (char *)CONCAT17(uVar3,in_stack_fffffffffffffda0),line,
               (char *)CONCAT17(uVar4,in_stack_fffffffffffffd90));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffd80));
    testing::Message::~Message((Message *)0x124d8e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x124ddd);
  return;
}

Assistant:

TEST(CoreTest, FormatForeignStrings) {
  using namespace my_ns;
  using namespace FakeQt;
  EXPECT_EQ(fmt::format(my_string<char>("{}"), 42), "42");
  EXPECT_EQ(fmt::format(my_string<wchar_t>(L"{}"), 42), L"42");
  EXPECT_EQ(fmt::format(QString(L"{}"), 42), L"42");
  EXPECT_EQ(fmt::format(QString(L"{}"), my_string<wchar_t>(L"42")), L"42");
  EXPECT_EQ(fmt::format(my_string<wchar_t>(L"{}"), QString(L"42")), L"42");
}